

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# indirect_string.cpp
# Opt level: O2

bool __thiscall pstore::indirect_string::operator<(indirect_string *this,indirect_string *rhs)

{
  bool bVar1;
  shared_sstring_view rhs_owner;
  raw_sstring_view local_68;
  shared_sstring_view lhs_owner;
  not_null<pstore::sstring_view<std::shared_ptr<const_char>_>_*> local_38;
  not_null<pstore::sstring_view<std::shared_ptr<const_char>_>_*> local_30;
  raw_sstring_view local_28;
  
  if (this->db_ == rhs->db_) {
    local_30.ptr_ = &lhs_owner;
    lhs_owner.size_ = 0;
    rhs_owner.size_ = 0;
    lhs_owner.ptr_.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    lhs_owner.ptr_.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    rhs_owner.ptr_.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    rhs_owner.ptr_.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    gsl::not_null<pstore::sstring_view<std::shared_ptr<const_char>_>_*>::ensure_invariant(&local_30)
    ;
    local_68 = as_string_view(this,local_30);
    local_38.ptr_ = &rhs_owner;
    gsl::not_null<pstore::sstring_view<std::shared_ptr<const_char>_>_*>::ensure_invariant(&local_38)
    ;
    local_28 = as_string_view(rhs,local_38);
    bVar1 = pstore::operator<(&local_68,&local_28);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&rhs_owner.ptr_.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&lhs_owner.ptr_.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    return bVar1;
  }
  assert_failed("&db_ == &rhs.db_",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/core/indirect_string.cpp"
                ,0x38);
}

Assistant:

bool indirect_string::operator< (indirect_string const & rhs) const {
        PSTORE_ASSERT (&db_ == &rhs.db_);
        shared_sstring_view lhs_owner;
        shared_sstring_view rhs_owner;
        return this->as_string_view (&lhs_owner) < rhs.as_string_view (&rhs_owner);
    }